

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O1

TreeDFIterator<const_spvtools::opt::SENode> * __thiscall
spvtools::opt::TreeDFIterator<const_spvtools::opt::SENode>::operator++
          (TreeDFIterator<const_spvtools::opt::SENode> *this)

{
  _Elt_pointer ppVar1;
  SENode **ppSVar2;
  pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>
  local_20;
  
  if (this->current_ != (NodePtr)0x0) {
    ppVar1 = (this->parent_iterators_).c.
             super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar1 == (this->parent_iterators_).c.
                  super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      this->current_ = (NodePtr)0x0;
    }
    else {
      if (ppVar1 == (this->parent_iterators_).c.
                    super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar1 = (this->parent_iterators_).c.
                 super__Deque_base<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      ppSVar2 = ppVar1[-1].second._M_current;
      this->current_ = *ppSVar2;
      ppSVar2 = ppSVar2 + 1;
      ppVar1[-1].second._M_current = ppSVar2;
      if (((ppVar1[-1].first)->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish == ppSVar2) {
        std::
        deque<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
        ::pop_back(&(this->parent_iterators_).c);
      }
      local_20.first = this->current_;
      if (((local_20.first)->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          ((local_20.first)->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_20.second._M_current =
             ((local_20.first)->children_).
             super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        std::
        deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>
        ::
        emplace_back<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>
                  ((deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>
                    *)&this->parent_iterators_,&local_20);
      }
    }
  }
  return this;
}

Assistant:

TreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }